

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O2

void __thiscall
cereal::InputArchive<cereal::PortableBinaryInputArchive,1u>::
process<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_char&,unsigned_short&,unsigned_char&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
          (InputArchive<cereal::PortableBinaryInputArchive,1u> *this,unsigned_short *head,
          unsigned_short *tail,unsigned_short *tail_1,unsigned_short *tail_2,uchar *tail_3,
          unsigned_short *tail_4,uchar *tail_5,unsigned_short *tail_6,unsigned_short *tail_7,
          unsigned_short *tail_8,unsigned_short *tail_9)

{
  process<unsigned_short&>(this,head);
  process<unsigned_short&,unsigned_short&,unsigned_short&,unsigned_char&,unsigned_short&,unsigned_char&,unsigned_short&,unsigned_short&,unsigned_short&,unsigned_short&>
            (this,tail,tail_1,tail_2,tail_3,tail_4,tail_5,tail_6,tail_7,tail_8,tail_9);
  return;
}

Assistant:

inline
      void process( T && head, Other && ... tail )
      {
        process( std::forward<T>( head ) );
        process( std::forward<Other>( tail )... );
      }